

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineFiller.cc
# Opt level: O1

vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
* __thiscall
LineFiller::fill_all_paths
          (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           *__return_storage_ptr__,LineFiller *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *lines)

{
  LineFiller *this_00;
  ostream *poVar1;
  ulong uVar2;
  pointer pvVar3;
  long lVar4;
  ulong uVar5;
  value_type line;
  vector<long,_std::allocator<long>_> local_78;
  vector<long,_std::allocator<long>_> local_60;
  vector<long,_std::allocator<long>_> local_48;
  
  this_00 = this + 0x10;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)this_00,
           ((long)(lines->
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(lines->
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar3 = (lines->
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((lines->
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      std::vector<long,_std::allocator<long>_>::vector
                (&local_78,
                 (vector<long,_std::allocator<long>_> *)
                 ((long)&(pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Processing line ",0x10);
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::vector<long,_std::allocator<long>_>::vector(&local_60,&local_78);
      line_fill(&local_48,this,&local_60);
      std::vector<long,_std::allocator<long>_>::_M_move_assign
                ((vector<long,_std::allocator<long>_> *)(*(long *)this_00 + lVar4),&local_48);
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar5 = uVar5 + 1;
      pvVar3 = (lines->
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(lines->
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
              -0x5555555555555555;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<sgNodeID_t >> LineFiller::fill_all_paths(std::vector<std::vector<sgNodeID_t >> lines){

    final_lines.resize(lines.size());
    auto total_ready = 0;
#pragma omp parallel for
    for (auto l=0; l<lines.size(); ++l){
        auto line = lines[l];
        std::cout << "Processing line " << total_ready << "/" << lines.size() <<std::endl;
        final_lines[l] = line_fill(line);
        total_ready++;
    }
    return final_lines;
}